

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.h
# Opt level: O1

void __thiscall chrono::ChLinkLockLock::~ChLinkLockLock(ChLinkLockLock *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
  super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkLockLock_00b3e5e8;
  p_Var1 = (this->motion_ang3).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->motion_ang2).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  ChLinkLock::~ChLinkLock(&this->super_ChLinkLock);
  free((void *)this[-1].deltaC_dtdt.rot.m_data[3]);
  return;
}

Assistant:

class ChApi ChLinkLockLock : public ChLinkLock {
  public:
    ChLinkLockLock();
    ChLinkLockLock(const ChLinkLockLock& other);

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLinkLockLock* Clone() const override { return new ChLinkLockLock(*this); }

    // Imposed motion functions

    void SetMotion_X(std::shared_ptr<ChFunction> m_funct);
    void SetMotion_Y(std::shared_ptr<ChFunction> m_funct);
    void SetMotion_Z(std::shared_ptr<ChFunction> m_funct);
    void SetMotion_ang(std::shared_ptr<ChFunction> m_funct);
    void SetMotion_ang2(std::shared_ptr<ChFunction> m_funct);
    void SetMotion_ang3(std::shared_ptr<ChFunction> m_funct);
    void SetMotion_axis(Vector m_axis);
    void Set_angleset(AngleSet mset) { angleset = mset; }

    std::shared_ptr<ChFunction> GetMotion_X() const { return motion_X; }
    std::shared_ptr<ChFunction> GetMotion_Y() const { return motion_Y; }
    std::shared_ptr<ChFunction> GetMotion_Z() const { return motion_Z; }
    std::shared_ptr<ChFunction> GetMotion_ang() const { return motion_ang; }
    std::shared_ptr<ChFunction> GetMotion_ang2() const { return motion_ang2; }
    std::shared_ptr<ChFunction> GetMotion_ang3() const { return motion_ang3; }
    const ChVector<>& GetMotion_axis() const { return motion_axis; }
    AngleSet Get_angleset() const { return angleset; }

    /// Get constraint violations in pos/rot coordinates.
    const Coordsys& GetRelC() const { return relC; }
    /// Get first time derivative of constraint violations in pos/rot coordinates.
    const Coordsys& GetRelC_dt() const { return relC_dt; }
    /// Get second time derivative of constraint violations in pos/rot coordinates.
    const Coordsys& GetRelC_dtdt() const { return relC_dtdt; }

    /// Method to allow serialization of transient data to archives.
    virtual void ArchiveOUT(ChArchiveOut& marchive) override;

    /// Method to allow deserialization of transient data from archives.
    virtual void ArchiveIN(ChArchiveIn& marchive) override;

  protected:
    std::shared_ptr<ChFunction> motion_X;     ///< user imposed motion for X coord, marker relative
    std::shared_ptr<ChFunction> motion_Y;     ///< user imposed motion for Y coord, marker relative
    std::shared_ptr<ChFunction> motion_Z;     ///< user imposed motion for Z coord, marker relative
    std::shared_ptr<ChFunction> motion_ang;   ///< user imposed angle rotation about axis
    std::shared_ptr<ChFunction> motion_ang2;  ///< user imposed angle rotation if three-angles rot.
    std::shared_ptr<ChFunction> motion_ang3;  ///< user imposed angle rotation if three-angles rot.
    Vector motion_axis;                       ///< this is the axis for the user imposed rotation
    AngleSet angleset;                        ///< type of rotation (3 Eul angles, angle/axis, etc.)

    Coordsys relC;       ///< relative constraint position: relC = (relM-deltaC)
    Coordsys relC_dt;    ///< relative constraint speed
    Coordsys relC_dtdt;  ///< relative constraint acceleration

    Coordsys deltaC;       ///< user-imposed rel. position
    Coordsys deltaC_dt;    ///< user-imposed rel. speed
    Coordsys deltaC_dtdt;  ///< user-imposed rel. acceleration

    /// Inherits, and also updates motion laws: deltaC, deltaC_dt, deltaC_dtdt
    virtual void UpdateTime(double mytime) override;

    /// Given current time and body state, computes the constraint differentiation to get the
    /// the state matrices Cq1,  Cq2,  Qc,  Ct , and also C, C_dt, C_dtd.
    virtual void UpdateState() override;
}